

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O3

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::directed_flag_complex_in_memory_t
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,directed_graph_t *graph,
          size_t nb_threads,int max_dimension)

{
  pointer *ppdVar1;
  iterator __position;
  long lVar2;
  ostream *poVar3;
  ushort uVar4;
  size_t sVar5;
  int max_dimension_00;
  ulong uVar6;
  vector<std::thread,_std::allocator<std::thread>_> t;
  unsigned_long local_88;
  int local_7c;
  size_t local_78;
  int local_6c;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> local_68;
  directed_graph_t *local_50;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_48;
  _func_void_int_int_directed_flag_complex_in_memory_t<std::pair<int,_float>_>_ptr_directed_graph_t_ptr_int
  *local_40;
  thread local_38;
  
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_cells).
  super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nb_threads = nb_threads;
  local_7c = max_dimension;
  local_78 = nb_threads;
  local_6c = max_dimension;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"constructing the directed flag complex",0x26);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r",1);
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::reserve(&this->vertex_cells,(ulong)graph->number_of_vertices);
  if (graph->number_of_vertices != 0) {
    uVar4 = 0;
    do {
      local_68.data.first = 0;
      local_68.data.second = 0.0;
      local_68.children =
           (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
            *)0x0;
      __position._M_current =
           (this->vertex_cells).
           super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.vertex = uVar4;
      if (__position._M_current ==
          (this->vertex_cells).
          super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>,std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>>
        ::_M_realloc_insert<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>
                  ((vector<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>,std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,float>>>>
                    *)this,__position,&local_68);
      }
      else {
        (__position._M_current)->children =
             (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
              *)0x0;
        uVar6 = (ulong)CONCAT22(local_68._2_2_,uVar4);
        (__position._M_current)->vertex = (short)uVar6;
        *(short *)&(__position._M_current)->field_0x2 = (short)(uVar6 >> 0x10);
        ((__position._M_current)->data).first = (int)(uVar6 >> 0x20);
        *(ulong *)&((__position._M_current)->data).second = (ulong)(uint)local_68._12_4_ << 0x20;
        ppdVar1 = &(this->vertex_cells).
                   super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppdVar1 = *ppdVar1 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < graph->number_of_vertices);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_68,nb_threads - 1,
             (allocator_type *)&local_88);
  local_88 = 0;
  sVar5 = 1;
  max_dimension_00 = local_6c;
  if (nb_threads != 1) {
    do {
      local_40 = construction_worker_thread<std::pair<int,float>>;
      local_50 = graph;
      local_48 = this;
      std::thread::
      thread<void(*)(int,int,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int),unsigned_long_const&,unsigned_long&,directed_flag_complex_in_memory_t<std::pair<int,float>>*,directed_graph_t_const*,int&,void>
                (&local_38,&local_40,&local_78,&local_88,&local_48,&local_50,&local_7c);
      lVar2 = CONCAT44(local_68.data.first,CONCAT22(local_68._2_2_,local_68.vertex));
      if (*(long *)(lVar2 + local_88 * 8) != 0) {
        std::terminate();
      }
      ((id *)(lVar2 + local_88 * 8))->_M_thread = (native_handle_type)local_38._M_id._M_thread;
      local_88 = local_88 + 1;
      sVar5 = local_78;
      max_dimension_00 = local_7c;
    } while (local_88 < local_78 - 1);
  }
  construction_worker_thread<std::pair<int,float>>
            ((int)sVar5,(int)sVar5 + -1,this,graph,max_dimension_00);
  if (local_78 != 1) {
    uVar6 = 0;
    do {
      std::thread::join();
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_78 - 1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&local_68);
  return;
}

Assistant:

directed_flag_complex_in_memory_t<ExtraData>::directed_flag_complex_in_memory_t(const directed_graph_t& graph,
                                                                                const size_t nb_threads,
                                                                                int max_dimension)
    : nb_threads(nb_threads) {
#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "constructing the directed flag complex" << std::flush << "\r";
#endif

	// First we add the vertices of the directed flag complex
	vertex_cells.reserve(graph.number_of_vertices);
	for (vertex_index_t index = 0; index < graph.number_of_vertices; index++)
		vertex_cells.push_back(directed_flag_complex_cell_in_memory_t<ExtraData>(index));

	// Now we start a few threads to construct the flag complex
	std::vector<std::thread> t(nb_threads - 1);

	for (auto index = 0ul; index < nb_threads - 1; ++index)
		t[index] = std::thread(&construction_worker_thread<ExtraData>, nb_threads, index, this, &graph, max_dimension);

	// Also do work in this thread, namely the last bit
	// For this last thread, take all the remaining vertices
	construction_worker_thread(nb_threads, nb_threads - 1, this, &graph, max_dimension);

	// Wait until all threads stopped
	for (auto i = 0ul; i < nb_threads - 1; ++i) t[i].join();
}